

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O2

VertexPacket * __thiscall rr::pa::Line::getProvokingVertex(Line *this)

{
  if (this->provokingIndex == 1) {
    return this->v1;
  }
  if (this->provokingIndex == 0) {
    return this->v0;
  }
  return (VertexPacket *)0x0;
}

Assistant:

VertexPacket* getProvokingVertex (void)
	{
		switch (provokingIndex)
		{
			case 0: return v0;
			case 1: return v1;
			default:
				DE_ASSERT(false);
				return DE_NULL;
		}
	}